

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_table.cpp
# Opt level: O1

void __thiscall
InlineTable_MustBeOneLine1_Test::~InlineTable_MustBeOneLine1_Test
          (InlineTable_MustBeOneLine1_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(InlineTable, MustBeOneLine1) {
    std::istringstream input("key = {\"key\" \n=123,\tkey=345 , 123 = \t'value' } ");
    events_aggregator_t handler;

    try {
        loltoml::parse(input, handler);
        FAIL();
    } catch (const loltoml::parser_error_t &e) {
        EXPECT_EQ(13, e.offset());
    }
}